

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *os,SelectionSet *ss)

{
  ostream *poVar1;
  long lVar2;
  int i;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    poVar1 = std::operator<<(os,"SelectionSet[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar3);
    poVar1 = std::operator<<(poVar1,"] = ");
    poVar1 = operator<<(poVar1,(OpenMDBitSet *)
                               ((long)&(((ss->bitsets_).
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                       super__Bvector_base<std::allocator<bool>_> + lVar2));
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0x28;
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SelectionSet& ss) {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      os << "SelectionSet[" << i << "] = " << ss.bitsets_[i] << std::endl;
    return os;
  }